

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O0

void __thiscall rw::World::addClump(World *this,Clump *clump)

{
  LLLink *pLVar1;
  LLLink *pLVar2;
  Atomic *atomic;
  Light *light;
  Camera *cam;
  Frame *pFVar3;
  LLLink *local_48;
  LLLink *lnk_2;
  LLLink *_next_2;
  LLLink *lnk_1;
  LLLink *_next_1;
  LLLink *lnk;
  LLLink *_next;
  Clump *clump_local;
  World *this_local;
  
  clump->world = this;
  LinkList::add(&this->clumps,&clump->inWorld);
  _next_1 = (clump->atomics).link.next;
  while( true ) {
    pLVar1 = _next_1->next;
    pLVar2 = LinkList::end(&clump->atomics);
    if (_next_1 == pLVar2) break;
    atomic = Atomic::fromClump(_next_1);
    addAtomic(this,atomic);
    _next_1 = pLVar1;
  }
  _next_2 = (clump->lights).link.next;
  while( true ) {
    pLVar1 = _next_2->next;
    pLVar2 = LinkList::end(&clump->lights);
    if (_next_2 == pLVar2) break;
    light = Light::fromClump(_next_2);
    addLight(this,light);
    _next_2 = pLVar1;
  }
  local_48 = (clump->cameras).link.next;
  while( true ) {
    pLVar1 = local_48->next;
    pLVar2 = LinkList::end(&clump->cameras);
    if (local_48 == pLVar2) break;
    cam = Camera::fromClump(local_48);
    addCamera(this,cam);
    local_48 = pLVar1;
  }
  pFVar3 = Clump::getFrame(clump);
  if (pFVar3 != (Frame *)0x0) {
    pFVar3 = Clump::getFrame(clump);
    Matrix::optimize(&pFVar3->matrix,(Tolerance *)0x0);
    pFVar3 = Clump::getFrame(clump);
    Frame::updateObjects(pFVar3);
  }
  return;
}

Assistant:

void
World::addClump(Clump *clump)
{
	assert(clump->world == nil);
	clump->world = this;
	this->clumps.add(&clump->inWorld);
	FORLIST(lnk, clump->atomics)
		this->addAtomic(Atomic::fromClump(lnk));
	FORLIST(lnk, clump->lights)
		this->addLight(Light::fromClump(lnk));
	FORLIST(lnk, clump->cameras)
		this->addCamera(Camera::fromClump(lnk));

	if(clump->getFrame()){
		clump->getFrame()->matrix.optimize();
		clump->getFrame()->updateObjects();
	}
}